

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderPrimitiveCoverage::initTest(TessellationShaderPrimitiveCoverage *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLubyte *pGVar4;
  NotSupportedError *this_00;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x708))(1,&this->m_vao_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                    ,0x176);
    (**(code **)(lVar3 + 0xd8))(this->m_vao_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                    ,0x179);
    initProgramObjects(this);
    initFramebuffer(this);
    initBufferObjects(this);
    pGVar4 = (GLubyte *)malloc(0x1000000);
    this->m_rendered_data_buffer = pGVar4;
    (**(code **)(lVar3 + 0x5e0))(0xb90);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Stencil test could not be enabled!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                    ,0x185);
    (**(code **)(lVar3 + 0x1a00))(0,0,0x800,0x800);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glViewport() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                    ,0x189);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Tessellation shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
             ,0x16e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderPrimitiveCoverage::initTest(void)
{
	/* Skip if GL_EXT_tessellation_shader extension is not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Initialize objects used by the test */
	initProgramObjects();
	initFramebuffer();
	initBufferObjects();

	/* setup of pixels buffer for fetching data*/
	m_rendered_data_buffer = (glw::GLubyte*)malloc(m_rendered_data_buffer_size);

	/* Enable stencil test. */
	gl.enable(GL_STENCIL_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Stencil test could not be enabled!");

	/* Set up viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_width, m_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed!");
}